

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (ulong)X->n;
  if (uVar4 != 0) {
    do {
      if (X->p[uVar4 - 1] != 0) goto LAB_0034f35c;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
  }
LAB_0034f35c:
  uVar3 = (ulong)Y->n;
  if (uVar3 != 0) {
    do {
      if (Y->p[uVar3 - 1] != 0) goto LAB_0034f377;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar3 = 0;
  }
LAB_0034f377:
  if (uVar3 != 0 || uVar4 != 0) {
    if (uVar3 < uVar4) {
      return (int)X->s;
    }
    if (uVar4 < uVar3) {
      return -(int)Y->s;
    }
    sVar1 = X->s;
    if ((0 < sVar1) && (Y->s < 0)) {
      return 1;
    }
    if ((sVar1 < 0) && (0 < Y->s)) {
      return -1;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      uVar3 = Y->p[uVar4];
      uVar2 = X->p[uVar4];
      if (uVar2 >= uVar3 && uVar2 != uVar3) {
        return (int)sVar1;
      }
      if (uVar2 < uVar3) {
        return -(int)sVar1;
      }
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_cmp_mpi(const mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    size_t i, j;

    for (i = X->n; i > 0; i--) {
        if (X->p[i - 1] != 0) {
            break;
        }
    }

    for (j = Y->n; j > 0; j--) {
        if (Y->p[j - 1] != 0) {
            break;
        }
    }

    if (i == 0 && j == 0) {
        return 0;
    }

    if (i > j) {
        return X->s;
    }
    if (j > i) {
        return -Y->s;
    }

    if (X->s > 0 && Y->s < 0) {
        return 1;
    }
    if (Y->s > 0 && X->s < 0) {
        return -1;
    }

    for (; i > 0; i--) {
        if (X->p[i - 1] > Y->p[i - 1]) {
            return X->s;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
            return -X->s;
        }
    }

    return 0;
}